

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteAdder(FILE *pFile,int nVars)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar7;
  ulong in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  
  uVar1 = Abc_Base10Log(nVars);
  if (0 < nVars) {
    uVar6 = (ulong)uVar1;
    fprintf((FILE *)pFile,".model ADD%d\n",(ulong)(uint)nVars);
    fwrite(".inputs",7,1,(FILE *)pFile);
    for (uVar3 = 0; nVars != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," a%0*d",uVar6,(ulong)uVar3);
    }
    for (uVar3 = 0; nVars != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," b%0*d",(ulong)uVar1,(ulong)uVar3);
    }
    fputc(10,(FILE *)pFile);
    fwrite(".outputs",8,1,(FILE *)pFile);
    for (uVar3 = 0; uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
        uVar8 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20), nVars + 1U != uVar3;
        uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," s%0*d",(ulong)uVar1,(ulong)uVar3);
    }
    fputc(10,(FILE *)pFile);
    uVar5 = 0;
    fwrite(".names c\n",9,1,(FILE *)pFile);
    if (nVars == 1) {
      fwrite(".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n",0x28,1,(FILE *)pFile);
    }
    else {
      fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n",(ulong)uVar1,0,
              (ulong)uVar1,0,CONCAT44(uVar7,uVar1),in_stack_ffffffffffffffb0 & 0xffffffff00000000,
              CONCAT44(uVar8,uVar1),uVar5 & 0xffffffff00000000);
      uVar2 = (ulong)(nVars - 1);
      uVar5 = 1;
      for (iVar4 = 2; nVars != iVar4; iVar4 = iVar4 + 1) {
        fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n",(ulong)uVar1
                ,uVar5,(ulong)uVar1,uVar5,uVar6,(ulong)((int)uVar5 - 1),uVar6,uVar5,uVar6,uVar5);
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n",(ulong)uVar1,
              uVar2,(ulong)uVar1,uVar2,uVar6,(ulong)(nVars - 2),uVar6,uVar2,uVar6,(ulong)(uint)nVars
             );
    }
    fwrite(".end\n",5,1,(FILE *)pFile);
    fputc(10,(FILE *)pFile);
    Abc_WriteFullAdder(pFile);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcGen.c"
                ,0x5a,"void Abc_WriteAdder(FILE *, int)");
}

Assistant:

void Abc_WriteAdder( FILE * pFile, int nVars )
{
    int i, nDigits = Abc_Base10Log( nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model ADD%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i <= nVars; i++ )
        fprintf( pFile, " s%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".names c\n" );
    if ( nVars == 1 )
        fprintf( pFile, ".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n" );
    else
    {
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n", nDigits, 0, nDigits, 0, nDigits, 0, nDigits, 0 );
        for ( i = 1; i < nVars-1; i++ )
            fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i );
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i+1 );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteFullAdder( pFile );
}